

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O1

void __thiscall PRM::Environment::Environment(Environment *this,int *_space_dimension)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  RandomPointGenerator *this_00;
  ulong uVar6;
  ulong uVar7;
  vctr *__range2;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  this->_vptr_Environment = (_func_int **)&PTR___cxa_pure_virtual_001264e8;
  (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = *_space_dimension;
  this->space_dimension = iVar9;
  std::vector<float,_std::allocator<float>_>::resize(&this->dimensions,(long)iVar9);
  auVar5 = _DAT_0011e100;
  auVar4 = _DAT_0011e0f0;
  auVar3 = _DAT_0011e0e0;
  pfVar1 = (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar1 != pfVar2) {
    uVar6 = (long)pfVar2 + (-4 - (long)pfVar1);
    auVar11._8_4_ = (int)uVar6;
    auVar11._0_8_ = uVar6;
    auVar11._12_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6 >> 2;
    auVar8._8_8_ = auVar11._8_8_ >> 2;
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_0011e100;
    do {
      auVar10._8_4_ = (int)uVar7;
      auVar10._0_8_ = uVar7;
      auVar10._12_4_ = (int)(uVar7 >> 0x20);
      auVar11 = (auVar10 | auVar4) ^ auVar5;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_)
                & 1)) {
        pfVar1[uVar7] = 10.0;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        pfVar1[uVar7 + 1] = 10.0;
      }
      auVar11 = (auVar10 | auVar3) ^ auVar5;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar11._0_4_ <= auVar8._0_4_)) {
        pfVar1[uVar7 + 2] = 10.0;
        pfVar1[uVar7 + 3] = 10.0;
      }
      uVar7 = uVar7 + 4;
    } while (((uVar6 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
  }
  this_00 = (RandomPointGenerator *)operator_new(0x20);
  RandomPointGenerator::RandomPointGenerator(this_00,&this->space_dimension,&this->dimensions);
  this->random = this_00;
  return;
}

Assistant:

Environment(const int& _space_dimension)
        
        {
            space_dimension=_space_dimension;
            dimensions.resize(space_dimension);
            for (auto& l:dimensions){l = 10.0;}
            random = new RandomPointGenerator(space_dimension,dimensions);
            
            return;
        }